

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint lodepng_inflate(uchar **out,size_t *outsize,uchar *in,size_t insize,
                    LodePNGDecompressSettings *settings)

{
  ulong uVar1;
  ushort uVar2;
  byte bVar3;
  uint uVar4;
  ulong uVar5;
  uchar *puVar6;
  uint *puVar7;
  uint *puVar8;
  uint *bitlen;
  uint *puVar9;
  uint uVar10;
  uint *puVar11;
  ulong uVar12;
  ulong uVar13;
  uint result_2;
  int iVar14;
  uint uVar15;
  uint result_1;
  int iVar16;
  uint uVar17;
  uchar *__ptr;
  size_t *psVar18;
  ulong uVar19;
  uint uVar20;
  uint result;
  int iVar21;
  int iVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  bool bVar26;
  bool bVar27;
  HuffmanTree tree_ll;
  size_t *local_110;
  ulong local_100;
  ulong local_d8;
  HuffmanTree local_a8;
  HuffmanTree local_88;
  HuffmanTree local_68;
  uchar **local_40;
  ulong *local_38;
  
  __ptr = *out;
  local_d8 = *outsize;
  uVar1 = insize * 8;
  uVar23 = 0;
  local_100 = 0;
  bVar26 = false;
  local_110 = (size_t *)0x0;
  uVar19 = local_d8;
  local_40 = out;
  local_38 = outsize;
  do {
    if (bVar26) {
      uVar4 = (uint)local_110;
      break;
    }
    uVar24 = uVar23 + 2;
    if (uVar24 < uVar1) {
      bVar26 = (in[uVar23 >> 3] >> ((uint)uVar23 & 7) & 1) != 0;
      uVar5 = uVar23 + 3;
      bVar3 = (in[uVar24 >> 3] >> ((byte)uVar24 & 7)) * '\x02' & 2 |
              (in[uVar23 + 1 >> 3] >> ((uint)(uVar23 + 1) & 7) & 1) != 0;
      if (bVar3 == 3) {
        outsize = (size_t *)0x14;
        bVar27 = false;
        uVar23 = uVar5;
      }
      else {
        uVar24 = uVar5;
        if (bVar3 == 0) {
          uVar12 = (ulong)((uint)uVar5 & 7);
          uVar24 = uVar23 + 4 + (uVar12 ^ 7);
          if (uVar12 == 0) {
            uVar24 = uVar5;
          }
          uVar5 = uVar24 >> 3;
          uVar23 = uVar5 + 4;
          if (uVar23 < insize) {
            uVar2 = *(ushort *)(in + uVar5);
            uVar17 = (uint)uVar2;
            uVar4 = (uint)uVar2;
            if (*(ushort *)(in + uVar5 + 2) + uVar4 == 0xffff) {
              uVar5 = local_100 + uVar4;
              if (uVar19 < uVar5) {
                uVar12 = uVar5 * 3 >> 1;
                if (uVar19 * 2 < uVar5) {
                  uVar12 = uVar5;
                }
                puVar6 = (uchar *)realloc(__ptr,uVar12);
                bVar27 = puVar6 == (uchar *)0x0;
                if (!bVar27) {
                  __ptr = puVar6;
                  uVar19 = uVar12;
                }
                outsize = (size_t *)((ulong)outsize & 0xffffffff);
              }
              else {
                bVar27 = false;
              }
              local_110 = (size_t *)0x53;
              if ((!bVar27) &&
                 (local_110 = (size_t *)0x17, local_d8 = uVar5, uVar4 + uVar23 <= insize)) {
                if (uVar2 != 0) {
                  do {
                    puVar6 = in + uVar23;
                    uVar23 = uVar23 + 1;
                    __ptr[local_100] = *puVar6;
                    local_100 = local_100 + 1;
                    uVar17 = uVar17 - 1;
                  } while (uVar17 != 0);
                }
                uVar24 = uVar23 << 3;
                local_110 = (size_t *)0x0;
              }
            }
            else {
              local_110 = (size_t *)0x15;
            }
          }
          else {
            local_110 = (size_t *)0x34;
          }
        }
        else {
          local_88.tree2d = (uint *)0x0;
          local_88.tree1d = (uint *)0x0;
          local_110 = (size_t *)0x0;
          local_88.lengths = (uint *)0x0;
          local_a8.tree2d = (uint *)0x0;
          local_a8.tree1d = (uint *)0x0;
          local_a8.lengths = (uint *)0x0;
          uVar4 = local_88.numcodes;
          puVar7 = local_88.tree2d;
          uVar17 = local_a8.numcodes;
          puVar8 = local_a8.tree2d;
          if (bVar3 == 2) {
            uVar12 = uVar23 + 0x11;
            local_110 = (size_t *)0x31;
            if (uVar12 <= uVar1) {
              iVar22 = 0;
              iVar21 = 0;
              do {
                iVar21 = iVar21 + ((uint)((in[uVar5 >> 3] >> ((uint)uVar5 & 7) & 1) != 0) <<
                                  ((byte)iVar22 & 0x1f));
                uVar5 = uVar5 + 1;
                iVar22 = iVar22 + 1;
              } while (iVar22 != 5);
              uVar24 = uVar23 + 8;
              iVar22 = 0;
              iVar16 = 0;
              do {
                iVar16 = iVar16 + ((uint)((in[uVar24 >> 3] >> ((uint)uVar24 & 7) & 1) != 0) <<
                                  ((byte)iVar22 & 0x1f));
                uVar24 = uVar24 + 1;
                iVar22 = iVar22 + 1;
              } while (iVar22 != 5);
              uVar23 = uVar23 + 0xd;
              iVar22 = 0;
              iVar14 = 0;
              do {
                iVar14 = iVar14 + ((uint)((in[uVar23 >> 3] >> ((uint)uVar23 & 7) & 1) != 0) <<
                                  ((byte)iVar22 & 0x1f));
                uVar23 = uVar23 + 1;
                iVar22 = iVar22 + 1;
              } while (iVar22 != 4);
              uVar24 = uVar12;
              if (uVar1 < (iVar14 + 4U) * 3 + uVar12) {
                local_110 = (size_t *)0x32;
              }
              else {
                local_68.tree2d = (uint *)0x0;
                local_68.tree1d = (uint *)0x0;
                local_68.lengths = (uint *)0x0;
                puVar7 = (uint *)malloc(0x4c);
                if (puVar7 == (uint *)0x0) {
                  puVar8 = (uint *)0x0;
                  bitlen = (uint *)0x0;
                  puVar7 = (uint *)0x0;
                  local_110 = (size_t *)0x53;
                }
                else {
                  uVar4 = iVar21 + 0x101;
                  uVar23 = 0;
                  local_110 = (size_t *)0x53;
                  do {
                    uVar17 = 0;
                    if (uVar23 < iVar14 + 4U) {
                      iVar22 = 0;
                      uVar17 = 0;
                      uVar5 = uVar24;
                      do {
                        uVar17 = uVar17 + ((uint)((in[uVar5 >> 3] >> ((uint)uVar5 & 7) & 1) != 0) <<
                                          ((byte)iVar22 & 0x1f));
                        uVar5 = uVar5 + 1;
                        iVar22 = iVar22 + 1;
                      } while (iVar22 != 3);
                      uVar24 = uVar24 + 3;
                    }
                    puVar7[CLCL_ORDER[uVar23]] = uVar17;
                    uVar23 = uVar23 + 1;
                  } while (uVar23 != 0x13);
                  uVar17 = HuffmanTree_makeFromLengths(&local_68,puVar7,0x13,7);
                  if (uVar17 == 0) {
                    puVar8 = (uint *)malloc(0x480);
                    bitlen = (uint *)malloc(0x80);
                    if (bitlen != (uint *)0x0 && puVar8 != (uint *)0x0) {
                      uVar12 = 0;
                      memset(puVar8,0,0x480);
                      bitlen[0] = 0;
                      bitlen[1] = 0;
                      bitlen[2] = 0;
                      bitlen[3] = 0;
                      bitlen[4] = 0;
                      bitlen[5] = 0;
                      bitlen[6] = 0;
                      bitlen[7] = 0;
                      bitlen[8] = 0;
                      bitlen[9] = 0;
                      bitlen[10] = 0;
                      bitlen[0xb] = 0;
                      bitlen[0xc] = 0;
                      bitlen[0xd] = 0;
                      bitlen[0xe] = 0;
                      bitlen[0xf] = 0;
                      bitlen[0x10] = 0;
                      bitlen[0x11] = 0;
                      bitlen[0x12] = 0;
                      bitlen[0x13] = 0;
                      bitlen[0x14] = 0;
                      bitlen[0x15] = 0;
                      bitlen[0x16] = 0;
                      bitlen[0x17] = 0;
                      bitlen[0x18] = 0;
                      bitlen[0x19] = 0;
                      bitlen[0x1a] = 0;
                      bitlen[0x1b] = 0;
                      bitlen[0x1c] = 0;
                      bitlen[0x1d] = 0;
                      bitlen[0x1e] = 0;
                      bitlen[0x1f] = 0;
                      uVar17 = iVar16 + 0x102 + iVar21;
                      uVar5 = (ulong)uVar17;
                      uVar23 = (ulong)uVar4;
                      iVar22 = -0x101 - iVar21;
                      psVar18 = (size_t *)0x0;
                      do {
                        uVar10 = (uint)uVar12;
                        local_110 = psVar18;
                        if (uVar17 <= uVar10) break;
                        uVar13 = uVar1;
                        if (uVar1 < uVar24) {
                          uVar13 = uVar24;
                        }
                        uVar15 = 0;
                        while (uVar25 = uVar13, uVar20 = 0xffffffff, uVar24 < uVar1) {
                          uVar20 = local_68.tree2d
                                   [(uint)((in[uVar24 >> 3] >> ((uint)uVar24 & 7) & 1) != 0) +
                                    uVar15 * 2];
                          uVar25 = uVar24 + 1;
                          uVar15 = uVar20 - local_68.numcodes;
                          if ((uVar20 < local_68.numcodes) ||
                             (uVar24 = uVar25, uVar20 = 0xffffffff, local_68.numcodes <= uVar15))
                          break;
                        }
                        uVar24 = uVar25;
                        if (uVar20 < 0x10) {
                          puVar11 = bitlen;
                          uVar15 = uVar4;
                          if (uVar10 < uVar4) {
                            uVar15 = 0;
                            puVar11 = puVar8;
                          }
                          puVar11[uVar10 - uVar15] = uVar20;
                          uVar12 = (ulong)(uVar10 + 1);
LAB_001a5923:
                          iVar16 = 0;
                        }
                        else {
                          iVar16 = 0xe;
                          local_110 = (size_t *)0x10;
                          if ((int)uVar20 < 0x11) {
                            if (uVar20 == 0xffffffff) {
                              local_110 = (size_t *)(ulong)(0xb - (uVar1 < uVar25));
                            }
                            else if (uVar20 == 0x10) {
                              if (uVar10 == 0) {
                                local_110 = (size_t *)0x36;
                                uVar12 = 0;
LAB_001a5aec:
                                bVar27 = false;
                                uVar24 = uVar25;
                                iVar16 = 0xe;
                              }
                              else {
                                uVar24 = uVar25 + 2;
                                iVar14 = 0;
                                if (uVar1 < uVar24) {
                                  local_110 = (size_t *)0x32;
                                  goto LAB_001a5aec;
                                }
                                iVar16 = 0;
                                do {
                                  iVar14 = iVar14 + ((uint)((in[uVar25 >> 3] >> ((uint)uVar25 & 7) &
                                                            1) != 0) << ((byte)iVar16 & 0x1f));
                                  uVar25 = uVar25 + 1;
                                  iVar16 = iVar16 + 1;
                                } while (iVar16 != 2);
                                puVar11 = bitlen + ((uVar10 - iVar21) - 0x102);
                                if (uVar10 < iVar21 + 0x102U) {
                                  puVar11 = puVar8 + (uVar10 - 1);
                                }
                                iVar16 = 0;
                                iVar14 = iVar14 + 3;
                                if (iVar14 != 0) {
                                  uVar10 = *puVar11;
                                  uVar12 = uVar12 & 0xffffffff;
                                  puVar11 = puVar8 + uVar12;
                                  do {
                                    if (uVar5 <= uVar12) {
                                      psVar18 = (size_t *)0xd;
                                      break;
                                    }
                                    puVar9 = bitlen + (uint)(iVar22 + (int)uVar12);
                                    if (uVar12 < uVar23) {
                                      puVar9 = puVar11;
                                    }
                                    *puVar9 = uVar10;
                                    uVar12 = uVar12 + 1;
                                    puVar11 = puVar11 + 1;
                                    iVar14 = iVar14 + -1;
                                  } while (iVar14 != 0);
                                }
                                bVar27 = true;
                                local_110 = psVar18;
                              }
                              if (bVar27) goto LAB_001a5923;
                            }
                          }
                          else {
                            if (uVar20 == 0x11) {
                              uVar13 = uVar25 + 3;
                              if (uVar13 <= uVar1) {
                                iVar16 = 0;
                                iVar14 = 0;
                                do {
                                  iVar14 = iVar14 + ((uint)((in[uVar25 >> 3] >> ((uint)uVar25 & 7) &
                                                            1) != 0) << ((byte)iVar16 & 0x1f));
                                  uVar25 = uVar25 + 1;
                                  iVar16 = iVar16 + 1;
                                } while (iVar16 != 3);
                                iVar14 = iVar14 + 3;
                                if (iVar14 != 0) {
                                  uVar12 = uVar12 & 0xffffffff;
                                  puVar11 = puVar8 + uVar12;
                                  do {
                                    if (uVar5 <= uVar12) {
                                      psVar18 = (size_t *)0xe;
                                      break;
                                    }
                                    puVar9 = bitlen + (uint)(iVar22 + (int)uVar12);
                                    if (uVar12 < uVar23) {
                                      puVar9 = puVar11;
                                    }
                                    *puVar9 = 0;
                                    uVar12 = uVar12 + 1;
                                    puVar11 = puVar11 + 1;
                                    iVar14 = iVar14 + -1;
                                  } while (iVar14 != 0);
                                }
                                goto LAB_001a5b9f;
                              }
LAB_001a5a57:
                              local_110 = (size_t *)0x32;
                              iVar16 = 0xe;
                            }
                            else {
                              if (uVar20 != 0x12) goto LAB_001a5928;
                              uVar13 = uVar25 + 7;
                              if (uVar1 < uVar13) goto LAB_001a5a57;
                              iVar16 = 0;
                              iVar14 = 0;
                              do {
                                iVar14 = iVar14 + ((uint)((in[uVar25 >> 3] >> ((uint)uVar25 & 7) & 1
                                                          ) != 0) << ((byte)iVar16 & 0x1f));
                                uVar25 = uVar25 + 1;
                                iVar16 = iVar16 + 1;
                              } while (iVar16 != 7);
                              iVar14 = iVar14 + 0xb;
                              if (iVar14 != 0) {
                                uVar12 = uVar12 & 0xffffffff;
                                puVar11 = puVar8 + uVar12;
                                do {
                                  if (uVar5 <= uVar12) {
                                    psVar18 = (size_t *)0xf;
                                    break;
                                  }
                                  puVar9 = bitlen + (uint)(iVar22 + (int)uVar12);
                                  if (uVar12 < uVar23) {
                                    puVar9 = puVar11;
                                  }
                                  *puVar9 = 0;
                                  uVar12 = uVar12 + 1;
                                  puVar11 = puVar11 + 1;
                                  iVar14 = iVar14 + -1;
                                } while (iVar14 != 0);
                              }
LAB_001a5b9f:
                              local_110 = psVar18;
                              uVar24 = uVar13;
                              iVar16 = 0;
                            }
                            if (uVar13 <= uVar1) goto LAB_001a5923;
                          }
                        }
LAB_001a5928:
                        psVar18 = local_110;
                      } while (iVar16 == 0);
                      if ((int)local_110 == 0) {
                        if (puVar8[0x100] == 0) {
                          local_110 = (size_t *)0x40;
                        }
                        else {
                          uVar4 = HuffmanTree_makeFromLengths(&local_88,puVar8,0x120,0xf);
                          if (uVar4 == 0) {
                            uVar4 = HuffmanTree_makeFromLengths(&local_a8,bitlen,0x20,0xf);
                            local_110 = (size_t *)(ulong)uVar4;
                          }
                          else {
                            local_110 = (size_t *)(ulong)uVar4;
                          }
                        }
                      }
                    }
                  }
                  else {
                    local_110 = (size_t *)(ulong)uVar17;
                    puVar8 = (uint *)0x0;
                    bitlen = (uint *)0x0;
                  }
                }
                free(puVar7);
                free(puVar8);
                free(bitlen);
                free(local_68.tree2d);
                free(local_68.tree1d);
                free(local_68.lengths);
                uVar4 = local_88.numcodes;
                puVar7 = local_88.tree2d;
                uVar17 = local_a8.numcodes;
                puVar8 = local_a8.tree2d;
              }
            }
          }
          else if (bVar3 == 1) {
            generateFixedLitLenTree(&local_88);
            generateFixedDistanceTree(&local_a8);
            local_110 = (size_t *)0x0;
            uVar4 = local_88.numcodes;
            puVar7 = local_88.tree2d;
            uVar17 = local_a8.numcodes;
            puVar8 = local_a8.tree2d;
          }
          do {
            if ((int)local_110 != 0) break;
            uVar23 = uVar1;
            if (uVar1 < uVar24) {
              uVar23 = uVar24;
            }
            uVar10 = 0;
            uVar5 = uVar24;
            while (uVar24 = uVar23, uVar15 = 0xffffffff, uVar5 < uVar1) {
              uVar15 = puVar7[(uint)((in[uVar5 >> 3] >> ((uint)uVar5 & 7) & 1) != 0) + uVar10 * 2];
              uVar24 = uVar5 + 1;
              uVar10 = uVar15 - uVar4;
              if ((uVar15 < uVar4) || (uVar5 = uVar24, uVar15 = 0xffffffff, uVar4 <= uVar10)) break;
            }
            if (uVar15 < 0x100) {
              uVar23 = local_100 + 1;
              if (uVar19 < uVar23) {
                uVar5 = uVar23 * 3 >> 1;
                if (uVar19 * 2 < uVar23) {
                  uVar5 = uVar23;
                }
                puVar6 = (uchar *)realloc(__ptr,uVar5);
                if (puVar6 == (uchar *)0x0) {
                  bVar27 = true;
                }
                else {
                  bVar27 = false;
                  __ptr = puVar6;
                  uVar19 = uVar5;
                }
              }
              else {
                bVar27 = false;
              }
              if (bVar27) {
                local_110 = (size_t *)0x53;
                bVar27 = false;
              }
              else {
                __ptr[local_100] = (uchar)uVar15;
                bVar27 = true;
                local_100 = uVar23;
                local_d8 = uVar23;
              }
            }
            else if (uVar15 < 0x11e && uVar15 != 0x100) {
              uVar23 = (ulong)(uVar15 - 0x101);
              uVar10 = LENGTHEXTRA[uVar23];
              if (uVar1 < uVar10 + uVar24) {
LAB_001a5db2:
                bVar27 = false;
                local_110 = (size_t *)0x33;
              }
              else {
                if (uVar23 - 0x1c < 0xffffffffffffffec) {
                  uVar12 = 0;
                }
                else {
                  uVar15 = 0;
                  uVar12 = 0;
                  uVar5 = uVar24;
                  do {
                    uVar12 = (ulong)((int)uVar12 +
                                    ((uint)((in[uVar5 >> 3] >> ((uint)uVar5 & 7) & 1) != 0) <<
                                    ((byte)uVar15 & 0x1f)));
                    uVar5 = uVar5 + 1;
                    uVar15 = uVar15 + 1;
                  } while (uVar10 != uVar15);
                  uVar24 = uVar24 + (uVar10 - 1) + 1;
                }
                uVar12 = LENGTHBASE[uVar23] + uVar12;
                uVar23 = uVar1;
                if (uVar1 < uVar24) {
                  uVar23 = uVar24;
                }
                uVar10 = 0;
                uVar5 = uVar24;
                do {
                  uVar13 = 0xffffffff;
                  uVar24 = uVar23;
                  if (uVar1 <= uVar5) break;
                  uVar15 = puVar8[(uint)((in[uVar5 >> 3] >> ((uint)uVar5 & 7) & 1) != 0) +
                                  uVar10 * 2];
                  uVar24 = uVar5 + 1;
                  uVar10 = uVar15 - uVar17;
                  if (uVar15 < uVar17) {
                    uVar13 = (ulong)uVar15;
                    break;
                  }
                  uVar5 = uVar24;
                } while (uVar10 < uVar17);
                if ((uint)uVar13 < 0x1e) {
                  uVar10 = DISTANCEEXTRA[uVar13];
                  iVar22 = 0;
                  if (uVar1 < uVar10 + uVar24) goto LAB_001a5db2;
                  if (3 < (uint)uVar13) {
                    uVar15 = 0;
                    iVar22 = 0;
                    uVar23 = uVar24;
                    do {
                      iVar22 = iVar22 + ((uint)((in[uVar23 >> 3] >> ((uint)uVar23 & 7) & 1) != 0) <<
                                        ((byte)uVar15 & 0x1f));
                      uVar23 = uVar23 + 1;
                      uVar15 = uVar15 + 1;
                    } while (uVar10 != uVar15);
                    uVar24 = uVar24 + (uVar10 - 1) + 1;
                  }
                  uVar23 = (ulong)(iVar22 + DISTANCEBASE[uVar13]);
                  if (local_100 < uVar23) {
                    local_110 = (size_t *)0x34;
                  }
                  else {
                    uVar5 = uVar12 + local_100;
                    if (uVar19 < uVar5) {
                      uVar13 = uVar5 * 3 >> 1;
                      if (uVar19 * 2 < uVar5) {
                        uVar13 = uVar5;
                      }
                      puVar6 = (uchar *)realloc(__ptr,uVar13);
                      bVar27 = puVar6 == (uchar *)0x0;
                      if (!bVar27) {
                        __ptr = puVar6;
                        uVar19 = uVar13;
                      }
                    }
                    else {
                      bVar27 = false;
                    }
                    if (!bVar27) {
                      local_d8 = uVar5;
                      if (uVar23 < uVar12) {
                        do {
                          __ptr[local_100] = __ptr[local_100 - uVar23];
                          local_100 = local_100 + 1;
                          bVar27 = true;
                          uVar12 = uVar12 - 1;
                        } while (uVar12 != 0);
                      }
                      else {
                        memcpy(__ptr + local_100,__ptr + (local_100 - uVar23),uVar12);
                        bVar27 = true;
                        local_100 = uVar5;
                      }
                      goto LAB_001a5f04;
                    }
                    local_110 = (size_t *)0x53;
                  }
                }
                else {
                  local_110 = (size_t *)0x12;
                }
LAB_001a5f01:
                bVar27 = false;
              }
            }
            else {
              if (uVar15 != 0x100) {
                local_110 = (size_t *)(ulong)(0xb - (uVar1 < uVar24));
                goto LAB_001a5f01;
              }
              bVar27 = false;
            }
LAB_001a5f04:
          } while (bVar27);
          free(puVar7);
          free(local_88.tree1d);
          free(local_88.lengths);
          free(puVar8);
          free(local_a8.tree1d);
          free(local_a8.lengths);
          outsize = (size_t *)((ulong)outsize & 0xffffffff);
        }
        bVar27 = (int)local_110 == 0;
        if (!bVar27) {
          outsize = local_110;
        }
        outsize = (size_t *)((ulong)outsize & 0xffffffff);
        uVar23 = uVar24;
      }
    }
    else {
      outsize = (size_t *)0x34;
      bVar27 = false;
    }
    uVar4 = (uint)outsize;
  } while (bVar27);
  *local_40 = __ptr;
  *local_38 = local_d8;
  return uVar4;
}

Assistant:

unsigned lodepng_inflate(unsigned char** out, size_t* outsize,
                         const unsigned char* in, size_t insize,
                         const LodePNGDecompressSettings* settings)
{
  unsigned error;
  ucvector v;
  ucvector_init_buffer(&v, *out, *outsize);
  error = lodepng_inflatev(&v, in, insize, settings);
  *out = v.data;
  *outsize = v.size;
  return error;
}